

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

ssize_t nghttp2_session_mem_send(nghttp2_session *session,uint8_t **data_ptr)

{
  int lib_error_code;
  int iVar1;
  ssize_t len;
  int rv;
  uint8_t **data_ptr_local;
  nghttp2_session *session_local;
  
  *data_ptr = (uint8_t *)0x0;
  session_local = (nghttp2_session *)nghttp2_session_mem_send_internal(session,data_ptr,1);
  if (((0 < (long)session_local) && ((session->aob).item != (nghttp2_outbound_item *)0x0)) &&
     (lib_error_code = session_after_frame_sent1(session), lib_error_code < 0)) {
    iVar1 = nghttp2_is_fatal(lib_error_code);
    if (iVar1 == 0) {
      __assert_fail("nghttp2_is_fatal(rv)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0xe0d,"ssize_t nghttp2_session_mem_send(nghttp2_session *, const uint8_t **)");
    }
    session_local = (nghttp2_session *)(long)lib_error_code;
  }
  return (ssize_t)session_local;
}

Assistant:

ssize_t nghttp2_session_mem_send(nghttp2_session *session,
                                 const uint8_t **data_ptr) {
  int rv;
  ssize_t len;

  *data_ptr = NULL;

  len = nghttp2_session_mem_send_internal(session, data_ptr, 1);
  if (len <= 0) {
    return len;
  }

  if (session->aob.item) {
    /* We have to call session_after_frame_sent1 here to handle stream
       closure upon transmission of frames.  Otherwise, END_STREAM may
       be reached to client before we call nghttp2_session_mem_send
       again and we may get exceeding number of incoming streams. */
    rv = session_after_frame_sent1(session);
    if (rv < 0) {
      assert(nghttp2_is_fatal(rv));
      return (ssize_t)rv;
    }
  }

  return len;
}